

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateExpectedTargetsCode
          (cmExportFileGenerator *this,ostream *os,string *expectedTargets)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,
                           "# Protect against multiple inclusion, which would fail when already imported targets are added once more.\nset(_targetsDefined)\nset(_targetsNotDefined)\nset(_expectedTargets)\nforeach(_expectedTarget "
                          );
  poVar1 = std::operator<<(poVar1,(string *)expectedTargets);
  std::operator<<(poVar1,
                  ")\n  list(APPEND _expectedTargets ${_expectedTarget})\n  if(NOT TARGET ${_expectedTarget})\n    list(APPEND _targetsNotDefined ${_expectedTarget})\n  endif()\n  if(TARGET ${_expectedTarget})\n    list(APPEND _targetsDefined ${_expectedTarget})\n  endif()\nendforeach()\nif(\"${_targetsDefined}\" STREQUAL \"${_expectedTargets}\")\n  unset(_targetsDefined)\n  unset(_targetsNotDefined)\n  unset(_expectedTargets)\n  set(CMAKE_IMPORT_FILE_VERSION)\n  cmake_policy(POP)\n  return()\nendif()\nif(NOT \"${_targetsDefined}\" STREQUAL \"\")\n  message(FATAL_ERROR \"Some (but not all) targets in this export set were already defined.\\nTargets Defined: ${_targetsDefined}\\nTargets not yet defined: ${_targetsNotDefined}\\n\")\nendif()\nunset(_targetsDefined)\nunset(_targetsNotDefined)\nunset(_expectedTargets)\n\n\n"
                 );
  return;
}

Assistant:

void cmExportFileGenerator::GenerateExpectedTargetsCode(
  std::ostream& os, const std::string& expectedTargets)
{
  /* clang-format off */
  os << "# Protect against multiple inclusion, which would fail when already "
        "imported targets are added once more.\n"
        "set(_targetsDefined)\n"
        "set(_targetsNotDefined)\n"
        "set(_expectedTargets)\n"
        "foreach(_expectedTarget " << expectedTargets << ")\n"
        "  list(APPEND _expectedTargets ${_expectedTarget})\n"
        "  if(NOT TARGET ${_expectedTarget})\n"
        "    list(APPEND _targetsNotDefined ${_expectedTarget})\n"
        "  endif()\n"
        "  if(TARGET ${_expectedTarget})\n"
        "    list(APPEND _targetsDefined ${_expectedTarget})\n"
        "  endif()\n"
        "endforeach()\n"
        "if(\"${_targetsDefined}\" STREQUAL \"${_expectedTargets}\")\n"
        "  unset(_targetsDefined)\n"
        "  unset(_targetsNotDefined)\n"
        "  unset(_expectedTargets)\n"
        "  set(CMAKE_IMPORT_FILE_VERSION)\n"
        "  cmake_policy(POP)\n"
        "  return()\n"
        "endif()\n"
        "if(NOT \"${_targetsDefined}\" STREQUAL \"\")\n"
        "  message(FATAL_ERROR \"Some (but not all) targets in this export "
        "set were already defined.\\nTargets Defined: ${_targetsDefined}\\n"
        "Targets not yet defined: ${_targetsNotDefined}\\n\")\n"
        "endif()\n"
        "unset(_targetsDefined)\n"
        "unset(_targetsNotDefined)\n"
        "unset(_expectedTargets)\n"
        "\n\n";
  /* clang-format on */
}